

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::FieldDefinition_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  uint uVar3;
  GeneratorOptions *options_00;
  GeneratorOptions *options_01;
  string *psVar4;
  Descriptor *this_00;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *pFVar8;
  char *local_1b0;
  char *local_1a8;
  string local_168;
  string local_148;
  string local_128 [8];
  string name;
  string type;
  string local_e0 [8];
  string qualifier;
  string local_a0;
  string local_70 [8];
  string value_type;
  string key_type;
  FieldDescriptor *value_field;
  FieldDescriptor *key_field;
  FieldDescriptor *field_local;
  GeneratorOptions *options_local;
  
  bVar1 = anon_unknown_0::IsMap((GeneratorOptions *)this,(FieldDescriptor *)options);
  if (bVar1) {
    options_00 = (GeneratorOptions *)anon_unknown_0::MapFieldKey((FieldDescriptor *)options);
    options_01 = (GeneratorOptions *)anon_unknown_0::MapFieldValue((FieldDescriptor *)options);
    ProtoTypeName_abi_cxx11_((string *)((long)&value_type.field_2 + 8),this,options_00,field);
    std::__cxx11::string::string(local_70);
    TVar2 = FieldDescriptor::type((FieldDescriptor *)options_01);
    pFVar8 = extraout_RDX;
    if ((TVar2 == TYPE_ENUM) ||
       (TVar2 = FieldDescriptor::type((FieldDescriptor *)options_01), pFVar8 = extraout_RDX_00,
       TVar2 == TYPE_MESSAGE)) {
      RelativeTypeName_abi_cxx11_(&local_a0,(_anonymous_namespace_ *)options_01,pFVar8);
      std::__cxx11::string::operator=(local_70,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      ProtoTypeName_abi_cxx11_((string *)((long)&qualifier.field_2 + 8),this,options_01,field);
      std::__cxx11::string::operator=(local_70,(string *)(qualifier.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(qualifier.field_2._M_local_buf + 8));
    }
    uVar5 = std::__cxx11::string::c_str();
    uVar6 = std::__cxx11::string::c_str();
    FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)options);
    uVar7 = std::__cxx11::string::c_str();
    uVar3 = FieldDescriptor::number((FieldDescriptor *)options);
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"map<%s, %s> %s = %d;",uVar5,uVar6,uVar7,(ulong)uVar3);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)(value_type.field_2._M_local_buf + 8));
  }
  else {
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)options);
    if (bVar1) {
      local_1a8 = "repeated";
    }
    else {
      bVar1 = FieldDescriptor::is_optional((FieldDescriptor *)options);
      if (bVar1) {
        local_1b0 = "optional";
      }
      else {
        local_1b0 = "required";
      }
      local_1a8 = local_1b0;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,local_1a8,(allocator *)(type.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(type.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_128);
    TVar2 = FieldDescriptor::type((FieldDescriptor *)options);
    pFVar8 = extraout_RDX_01;
    if ((TVar2 == TYPE_ENUM) ||
       (TVar2 = FieldDescriptor::type((FieldDescriptor *)options), pFVar8 = extraout_RDX_02,
       TVar2 == TYPE_MESSAGE)) {
      RelativeTypeName_abi_cxx11_(&local_148,(_anonymous_namespace_ *)options,pFVar8);
      std::__cxx11::string::operator=
                ((string *)(name.field_2._M_local_buf + 8),(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      psVar4 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)options);
      std::__cxx11::string::operator=(local_128,(string *)psVar4);
    }
    else {
      TVar2 = FieldDescriptor::type((FieldDescriptor *)options);
      if (TVar2 == TYPE_GROUP) {
        std::__cxx11::string::operator=((string *)(name.field_2._M_local_buf + 8),"group");
        this_00 = FieldDescriptor::message_type((FieldDescriptor *)options);
        psVar4 = Descriptor::name_abi_cxx11_(this_00);
        std::__cxx11::string::operator=(local_128,(string *)psVar4);
      }
      else {
        ProtoTypeName_abi_cxx11_(&local_168,this,options,field);
        std::__cxx11::string::operator=
                  ((string *)(name.field_2._M_local_buf + 8),(string *)&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        psVar4 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)options);
        std::__cxx11::string::operator=(local_128,(string *)psVar4);
      }
    }
    uVar5 = std::__cxx11::string::c_str();
    uVar6 = std::__cxx11::string::c_str();
    uVar7 = std::__cxx11::string::c_str();
    uVar3 = FieldDescriptor::number((FieldDescriptor *)options);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"%s %s %s = %d;",uVar5,uVar6,uVar7,(ulong)uVar3);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldDefinition(const GeneratorOptions& options,
                       const FieldDescriptor* field) {
  if (IsMap(options, field)) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    string key_type = ProtoTypeName(options, key_field);
    string value_type;
    if (value_field->type() == FieldDescriptor::TYPE_ENUM ||
        value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      value_type = RelativeTypeName(value_field);
    } else {
      value_type = ProtoTypeName(options, value_field);
    }
    return StringPrintf("map<%s, %s> %s = %d;",
                        key_type.c_str(),
                        value_type.c_str(),
                        field->name().c_str(),
                        field->number());
  } else {
    string qualifier = field->is_repeated() ? "repeated" :
        (field->is_optional() ? "optional" : "required");
    string type, name;
    if (field->type() == FieldDescriptor::TYPE_ENUM ||
        field->type() == FieldDescriptor::TYPE_MESSAGE) {
      type = RelativeTypeName(field);
      name = field->name();
    } else if (field->type() == FieldDescriptor::TYPE_GROUP) {
      type = "group";
      name = field->message_type()->name();
    } else {
      type = ProtoTypeName(options, field);
      name = field->name();
    }
    return StringPrintf("%s %s %s = %d;",
                        qualifier.c_str(),
                        type.c_str(),
                        name.c_str(),
                        field->number());
  }
}